

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrDestroyAnchorBD(XrAnchorBD anchor)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrAnchorBD_T_*>::getWithInstanceInfo(&g_anchorbd_info,anchor);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyAnchorBD)(anchor);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrAnchorBD_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_anchorbd_info.super_HandleInfoBase<XrAnchorBD_T_*,_GenValidUsageXrHandleInfo>,
               anchor);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyAnchorBD(
    XrAnchorBD anchor) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_anchorbd_info.getWithInstanceInfo(anchor);
        GenValidUsageXrHandleInfo *gen_anchorbd_info = info_with_instance.first;
        (void)gen_anchorbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyAnchorBD(anchor);
        if (XR_SUCCEEDED(result)) {
            g_anchorbd_info.erase(anchor);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}